

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  ~IfcElectricDistributionPoint
            ((IfcElectricDistributionPoint *)
             ((long)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                     super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                     field_0x0 +
             *(long *)(*(long *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                                 super_IfcDistributionElement.super_IfcElement.super_IfcProduct.
                                 super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}